

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::read_exponent_and_suffix
          (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this)

{
  Position *this_00;
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  this_00 = &this->m_position;
  pbVar4 = (byte *)(this->m_position).m_pos;
  pbVar3 = (byte *)(this->m_position).m_end;
  pbVar2 = pbVar4;
  if ((pbVar4 != pbVar3) && (iVar1 = tolower((int)(char)*pbVar4), pbVar2 = pbVar3, iVar1 == 0x65)) {
    Position::operator++(this_00);
    pbVar4 = (byte *)(this->m_position).m_pos;
    pbVar3 = pbVar4;
    if ((pbVar4 != (byte *)(this->m_position).m_end) && ((*pbVar4 == 0x2d || (*pbVar4 == 0x2b)))) {
      Position::operator++(this_00);
      pbVar4 = (byte *)(this->m_position).m_pos;
      pbVar3 = pbVar4;
    }
    while ((pbVar2 = (byte *)(this->m_position).m_end, pbVar4 != pbVar2 &&
           (m_alphabet._M_elems[2]._M_elems[*pbVar4] == true))) {
      Position::operator++(this_00);
      pbVar4 = (byte *)(this->m_position).m_pos;
    }
    if (pbVar4 == pbVar3) {
      return false;
    }
  }
  while ((pbVar4 != pbVar2 && (m_alphabet._M_elems[0xb]._M_elems[*pbVar4] == true))) {
    Position::operator++(this_00);
    pbVar4 = (byte *)(this->m_position).m_pos;
    pbVar2 = (byte *)(this->m_position).m_end;
  }
  return true;
}

Assistant:

bool read_exponent_and_suffix() noexcept {
        // Support a form of scientific notation: 1e-5, 35.5E+8, 0.01e19
        if (m_position.has_more() && (std::tolower(*m_position) == 'e')) {
          ++m_position;
          if (m_position.has_more() && ((*m_position == '-') || (*m_position == '+'))) {
            ++m_position;
          }
          auto exponent_pos = m_position;
          while (m_position.has_more() && char_in_alphabet(*m_position, detail::int_alphabet)) {
            ++m_position;
          }
          if (m_position == exponent_pos) {
            // Require at least one digit after the exponent
            return false;
          }
        }

        // Parse optional float suffix
        while (m_position.has_more() && char_in_alphabet(*m_position, detail::float_suffix_alphabet)) {
          ++m_position;
        }

        return true;
      }